

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emoticon.cpp
# Opt level: O0

void __thiscall CEmoticon::OnRender(CEmoticon *this)

{
  long lVar1;
  int iVar2;
  IClient *this_00;
  CUIRect *pCVar3;
  IGraphics *pIVar4;
  CUI *in_RDI;
  long in_FS_OFFSET;
  float fVar5;
  vector2_base<float> vVar6;
  float NudgeY;
  float NudgeX;
  float Size;
  bool Selected;
  float Angle;
  int i;
  float SelectedAngle;
  CQuadItem QuadItem;
  CUIRect Screen;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float local_54;
  int local_50;
  float local_4c;
  CQuadItem local_3c;
  uint local_2c;
  ulong uVar7;
  undefined8 uVar8;
  vector2_base<float> in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = CComponent::Client((CComponent *)0x161f8a);
  iVar2 = IClient::State(this_00);
  if (iVar2 < 3) {
    *(bool *)((long)&in_RDI->m_pActiveItem + 1) = false;
    *(bool *)&in_RDI->m_pActiveItem = false;
  }
  else if (((ulong)in_RDI->m_pActiveItem & 0x100) == 0) {
    if ((((ulong)in_RDI->m_pActiveItem & 1) != 0) &&
       (*(int *)((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)&in_RDI->m_pLastActiveItem + 1
                ) != -1)) {
      Emote((CEmoticon *)in_RDI,in_stack_ffffffffffffff8c);
    }
    *(bool *)&in_RDI->m_pActiveItem = false;
  }
  else if ((((((CGameClient *)in_RDI->m_pHotItem)->m_Snap).m_SpecInfo.m_Active & 1U) == 0) &&
          (((((CGameClient *)in_RDI->m_pHotItem)->m_Snap).m_pGameData == (CNetObj_GameData *)0x0 ||
           ((((((CGameClient *)in_RDI->m_pHotItem)->m_Snap).m_pGameData)->m_GameStateFlags & 8U) ==
            0)))) {
    *(bool *)&in_RDI->m_pActiveItem = true;
    fVar5 = length((vector2_base<float> *)0x162049);
    if (170.0 < fVar5) {
      in_stack_ffffffffffffffe8 =
           normalize((vector2_base<float> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      vVar6 = vector2_base<float>::operator*
                        ((vector2_base<float> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c);
      *(vector2_base<float> *)((long)&in_RDI->m_pActiveItem + 4) = vVar6;
    }
    local_4c = angle((vector2_base<float> *)0x16209e);
    local_4c = local_4c + 0.2617994;
    if (local_4c < 0.0) {
      local_4c = local_4c + 6.2831855;
    }
    fVar5 = length((vector2_base<float> *)0x1620dc);
    if (fVar5 <= 110.0) {
      ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)&in_RDI->m_pLastActiveItem)[1].y = -NAN;
    }
    else {
      ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)&in_RDI->m_pLastActiveItem)[1] =
           (anon_union_4_2_947302a4_for_vector2_base<float>_3)(int)((local_4c / 6.2831855) * 16.0);
    }
    CComponent::UI((CComponent *)0x16212b);
    pCVar3 = CUI::Screen(in_RDI);
    uVar7._0_4_ = pCVar3->x;
    uVar7._4_4_ = pCVar3->y;
    uVar8._0_4_ = pCVar3->w;
    uVar8._4_4_ = pCVar3->h;
    pIVar4 = CComponent::Graphics((CComponent *)0x16214e);
    (*(pIVar4->super_IInterface)._vptr_IInterface[5])
              (uVar7 & 0xffffffff,(int)(uVar7 >> 0x20),(int)uVar8,(int)((ulong)uVar8 >> 0x20));
    pIVar4 = CComponent::Graphics((CComponent *)0x162179);
    (*(pIVar4->super_IInterface)._vptr_IInterface[8])();
    CComponent::Graphics((CComponent *)0x16218c);
    IGraphics::TextureClear((IGraphics *)in_RDI);
    pIVar4 = CComponent::Graphics((CComponent *)0x16219e);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x17])();
    pIVar4 = CComponent::Graphics((CComponent *)0x1621b4);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x21])(0,0,0,0x3e99999a);
    DrawCircle((CEmoticon *)in_stack_ffffffffffffffe8,(float)((ulong)uVar8 >> 0x20),(float)uVar8,
               (float)(uVar7 >> 0x20),(int)uVar7);
    pIVar4 = CComponent::Graphics((CComponent *)0x162216);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x18])();
    pIVar4 = CComponent::Graphics((CComponent *)0x16222c);
    local_2c = g_pData->m_aImages[6].m_Id.m_Id;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x13])(pIVar4,(ulong)local_2c);
    pIVar4 = CComponent::Graphics((CComponent *)0x16225e);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x17])();
    for (local_50 = 0; local_50 < 0x10; local_50 = local_50 + 1) {
      local_54 = ((float)local_50 * 6.2831855) / 16.0;
      if (3.1415927 < local_54) {
        local_54 = local_54 - 6.2831855;
      }
      in_stack_ffffffffffffffa4 = 80.0;
      if (*(int *)((long)&in_RDI->m_pLastActiveItem + 4) != local_50) {
        in_stack_ffffffffffffffa4 = 50.0;
      }
      in_stack_ffffffffffffffa0 = cosf(local_54);
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 * 150.0;
      in_stack_ffffffffffffff9c = sinf(local_54);
      in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c * 150.0;
      CComponent::RenderTools((CComponent *)0x162365);
      CRenderTools::SelectSprite
                ((CRenderTools *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (int)in_stack_ffffffffffffff9c,(int)in_stack_ffffffffffffff98,
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      IGraphics::CQuadItem::CQuadItem
                (&local_3c,(float)uVar8 / 2.0 + in_stack_ffffffffffffffa0,
                 (float)((ulong)uVar8 >> 0x20) / 2.0 + in_stack_ffffffffffffff9c,
                 in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa4);
      pIVar4 = CComponent::Graphics((CComponent *)0x1623cd);
      (*(pIVar4->super_IInterface)._vptr_IInterface[0x1c])(pIVar4,&local_3c,1);
    }
    pIVar4 = CComponent::Graphics((CComponent *)0x1623fd);
    fVar5 = (float)((ulong)in_RDI >> 0x20);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x18])();
    CComponent::RenderTools((CComponent *)0x162413);
    CRenderTools::RenderCursor
              ((CRenderTools *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,fVar5);
  }
  else {
    *(bool *)((long)&in_RDI->m_pActiveItem + 1) = false;
    *(bool *)&in_RDI->m_pActiveItem = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEmoticon::OnRender()
{
	if(Client()->State() < IClient::STATE_ONLINE)
	{
		m_Active = false;
		m_WasActive = false;
		return;
	}

	if(!m_Active)
	{
		if(m_WasActive && m_SelectedEmote != -1)
			Emote(m_SelectedEmote);
		m_WasActive = false;
		return;
	}

	if(m_pClient->m_Snap.m_SpecInfo.m_Active || (m_pClient->m_Snap.m_pGameData && m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_GAMEOVER))
	{
		m_Active = false;
		m_WasActive = false;
		return;
	}

	m_WasActive = true;

	if (length(m_SelectorMouse) > 170.0f)
		m_SelectorMouse = normalize(m_SelectorMouse) * 170.0f;

	float SelectedAngle = angle(m_SelectorMouse) + 2*pi/24;
	if (SelectedAngle < 0)
		SelectedAngle += 2*pi;

	if (length(m_SelectorMouse) > 110.0f)
		m_SelectedEmote = (int)(SelectedAngle / (2*pi) * NUM_EMOTICONS);
	else
		m_SelectedEmote = -1;

	CUIRect Screen = *UI()->Screen();

	Graphics()->MapScreen(Screen.x, Screen.y, Screen.w, Screen.h);

	Graphics()->BlendNormal();

	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	Graphics()->SetColor(0,0,0,0.3f);
	DrawCircle(Screen.w/2, Screen.h/2, 190.0f, 64);
	Graphics()->QuadsEnd();

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_EMOTICONS].m_Id);
	Graphics()->QuadsBegin();

	for (int i = 0; i < NUM_EMOTICONS; i++)
	{
		float Angle = 2*pi*i/NUM_EMOTICONS;
		if (Angle > pi)
			Angle -= 2*pi;

		bool Selected = m_SelectedEmote == i;

		float Size = Selected ? 80.0f : 50.0f;

		float NudgeX = 150.0f * cosf(Angle);
		float NudgeY = 150.0f * sinf(Angle);
		RenderTools()->SelectSprite(SPRITE_OOP + i);
		IGraphics::CQuadItem QuadItem(Screen.w/2 + NudgeX, Screen.h/2 + NudgeY, Size, Size);
		Graphics()->QuadsDraw(&QuadItem, 1);
	}

	Graphics()->QuadsEnd();

	RenderTools()->RenderCursor(m_SelectorMouse.x + Screen.w/2, m_SelectorMouse.y + Screen.h/2, 24.0f);
}